

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O2

void testExistingStreams(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  Rgba __filename;
  undefined8 uVar3;
  Rgba *pRVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  int *piVar10;
  char *pcVar11;
  Box<Imath_3_2::Vec2<int>_> *pBVar12;
  Box<Imath_3_2::Vec2<int>_> *pBVar13;
  undefined1 *puVar14;
  pointer pHVar15;
  half *phVar16;
  int h;
  int h_00;
  Compression CVar17;
  Rgba RVar18;
  long lVar19;
  int x;
  ulong uVar20;
  int iVar21;
  int iVar22;
  half *phVar23;
  long lVar24;
  int i;
  long lVar25;
  ulong uVar26;
  int y;
  long lVar27;
  long lVar28;
  Header header;
  half hStack_356;
  half hStack_354;
  half hStack_352;
  ulong local_350;
  Rgba *local_348;
  ulong *local_340;
  ulong *local_338;
  undefined8 local_330;
  Rgba local_320;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  RgbaOutputFile out;
  half hStack_2fe;
  half hStack_2fc;
  half hStack_2fa;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  FrameBuffer f;
  Array2D<Imf_3_2::Rgba> p1;
  int local_298;
  StdOFStream ofs;
  MultiPartOutputFile out_4;
  ofstream os;
  char local_230 [8];
  char local_228 [504];
  
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "Testing reading and writing using existing streams");
  std::endl<char,std::char_traits<char>>(poVar9);
  uVar26 = 0;
  do {
    CVar17 = (Compression)uVar26;
    if (CVar17 == NUM_COMPRESSION_METHODS) {
      poVar9 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar9);
      return;
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"compression: ");
    uVar20 = uVar26;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,CVar17);
    iVar7 = (int)uVar20;
    std::endl<char,std::char_traits<char>>(poVar9);
    p1._sizeX = 0xed;
    p1._sizeY = 0x77;
    p1._data = (Rgba *)operator_new__(0x37158);
    anon_unknown.dwarf_12400a::fillPixels1(&p1,iVar7,h);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,tempDir,
                   "imf_test_streams.exr");
    uVar3 = f._map._M_t._M_impl._0_8_;
    poVar9 = std::operator<<((ostream *)&std::cout,"scan-line based file:");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"writing");
    remove((char *)uVar3);
    std::ofstream::ofstream(&os);
    std::filebuf::open(local_230,(_Ios_Openmode)uVar3);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)uVar3);
    _out = 0;
    hStack_2fe._h = 0;
    hStack_2fc._h = 0;
    hStack_2fa._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,CVar17);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&ofs,&header,WRITE_RGBA,iVar7);
    Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_2::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    std::ofstream::~ofstream(&os);
    std::operator<<((ostream *)&std::cout,", reading");
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)uVar3);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&header,(ifstream *)&os,(char *)uVar3);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar7);
    local_320 = (Rgba)uVar26;
    piVar10 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar7 = *piVar10;
    lVar27 = (long)piVar10[2] - (long)iVar7;
    iVar8 = piVar10[1];
    lVar25 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&out,lVar25 + 1,lVar27 + 1);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,
               (ulong)((Rgba *)(-(long)iVar8 * local_2f8 * 8 + local_2f0._M_allocated_capacity) +
                      -(long)iVar7),1);
    RVar18 = local_320;
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    cVar5 = Imf_3_2::isLossyCompression(RVar18._0_4_);
    if (cVar5 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar23 = &(p1._data)->a;
      phVar16 = (half *)(local_2f0._M_allocated_capacity + 6);
      for (lVar28 = 0; lVar28 <= (int)lVar25; lVar28 = lVar28 + 1) {
        lVar24 = 0;
        while (lVar24 <= (int)lVar27) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x149,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14a,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14b,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4]._h * 4);
          lVar19 = lVar24 * 4;
          lVar24 = lVar24 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x14c,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar23 = phVar23 + p1._sizeY * 4;
        phVar16 = phVar16 + local_2f8 * 4;
      }
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&out);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&header);
    std::ifstream::~ifstream(&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
    anon_unknown.dwarf_12400a::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)uVar3);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar7);
    piVar10 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar7 = *piVar10;
    lVar27 = (long)piVar10[2] - (long)iVar7;
    iVar8 = piVar10[1];
    lVar25 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
              ((Array2D<Imf_3_2::Rgba> *)&header,lVar25 + 1,lVar27 + 1);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(ulong)(local_348 + (-(long)iVar8 * local_350 - (long)iVar7)),1);
    RVar18 = local_320;
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    cVar5 = Imf_3_2::isLossyCompression(RVar18._0_4_);
    if (cVar5 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar23 = &(p1._data)->a;
      phVar16 = &local_348->a;
      for (lVar28 = 0; lVar28 <= (int)lVar25; lVar28 = lVar28 + 1) {
        lVar24 = 0;
        while (lVar24 <= (int)lVar27) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x168,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x169,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x16a,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4]._h * 4);
          lVar19 = lVar24 * 4;
          lVar24 = lVar24 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x16b,
                          "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar23 = phVar23 + p1._sizeY * 4;
        phVar16 = phVar16 + local_350 * 4;
      }
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&header);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    anon_unknown.dwarf_12400a::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    remove((char *)uVar3);
    std::__cxx11::string::~string((string *)&f);
    poVar9 = std::operator<<((ostream *)&std::cout,"scan-line based stringstream:");
    std::endl<char,std::char_traits<char>>(poVar9);
    _header = (Rgba)&local_348;
    local_350 = 0;
    local_348 = (Rgba *)((ulong)local_348 & 0xffffffffffffff00);
    std::operator<<((ostream *)&std::cout,"writing");
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    f._map._M_t._M_impl._0_8_ = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&f,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,iVar7);
    Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_2::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_2::Header::~Header((Header *)&ofs);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading");
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar7);
    piVar10 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar7 = *piVar10;
    lVar28 = (long)piVar10[2] - (long)iVar7;
    iVar8 = piVar10[1];
    lVar25 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&f,lVar25 + 1,lVar28 + 1);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,
               (long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
               (long)iVar7 * -8 +
               -(long)iVar8 * f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar10[1]);
    std::operator<<((ostream *)&std::cout,", comparing");
    RVar18 = local_320;
    phVar16 = &(p1._data)->a;
    puVar14 = &(f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x6;
    for (lVar27 = 0; lVar27 <= (int)lVar25; lVar27 = lVar27 + 1) {
      lVar24 = 0;
      while (lVar24 <= (int)lVar28) {
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar14 + lVar24 * 8 + -6) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].r == p1[y][x].r",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x2ff,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar14 + lVar24 * 8 + -4) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].g == p1[y][x].g",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x300,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar14 + lVar24 * 8 + -2) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].b == p1[y][x].b",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x301,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(puVar14 + lVar24 * 8) * 4
                          );
        lVar19 = lVar24 * 4;
        lVar24 = lVar24 + 1;
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar19]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].a == p1[y][x].a",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x302,
                        "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                       );
        }
      }
      phVar16 = phVar16 + p1._sizeY * 4;
      puVar14 = puVar14 + f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8;
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&f);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&header);
    lVar25 = 0;
    for (lVar27 = 0; lVar27 != 0xed; lVar27 = lVar27 + 1) {
      lVar28 = 6;
      for (lVar24 = 0; pRVar4 = p1._data, lVar24 != 0x77; lVar24 = lVar24 + 1) {
        lVar19 = p1._sizeY * lVar25;
        phVar16 = &(p1._data)->r;
        Imath_3_2::half::operator=
                  ((half *)((long)p1._data + lVar28 + lVar19 + -6),(float)((uint)lVar24 & 2));
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar4 + lVar28 + lVar19 + -4),
                   (float)((uint)lVar27 + (uint)lVar24 & 2));
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar4 + lVar28 + lVar19 + -2),(float)((uint)lVar27 & 2));
        Imath_3_2::half::operator=
                  ((half *)((long)&phVar16->_h + lVar28 + lVar19),
                   (*(float *)(_imath_half_to_float_table +
                              (ulong)*(uint16_t *)((long)&pRVar4[lVar24].r._h + lVar19) * 4) +
                    *(float *)(_imath_half_to_float_table +
                              (ulong)*(uint16_t *)((long)&pRVar4[lVar24].b._h + lVar19) * 4) +
                   *(float *)(_imath_half_to_float_table +
                             (ulong)*(uint16_t *)((long)&pRVar4[lVar24].g._h + lVar19) * 4)) / 3.0);
        lVar28 = lVar28 + 8;
      }
      lVar25 = lVar25 + 8;
      RVar18 = local_320;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,tempDir,
                   "imf_test_streams2.exr");
    uVar3 = f._map._M_t._M_impl._0_8_;
    poVar9 = std::operator<<((ostream *)&std::cout,"tiled file:");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"writing");
    remove((char *)uVar3);
    std::ofstream::ofstream(&os);
    std::filebuf::open(local_230,(_Ios_Openmode)uVar3);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)uVar3);
    _out = 0;
    hStack_2fe._h = 0;
    hStack_2fc._h = 0;
    hStack_2fa._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,SUB84(RVar18,0));
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&ofs,&header,WRITE_RGBA,0x14,0x14,ONE_LEVEL,
               ROUND_DOWN,iVar7);
    Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar21 = (int)(Rgba *)&out;
    iVar7 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar21);
    iVar8 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar21);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar21,0,iVar7 + -1,0,iVar8 + -1);
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    std::ofstream::~ofstream(&os);
    std::operator<<((ostream *)&std::cout,", reading");
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)uVar3);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)uVar3);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&header,(IStream *)&ofs,iVar7);
    piVar10 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar7 = *piVar10;
    lVar27 = (long)piVar10[2] - (long)iVar7;
    iVar8 = piVar10[1];
    lVar25 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&out,lVar25 + 1,lVar27 + 1);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&header,
               (ulong)((Rgba *)(-(long)iVar8 * local_2f8 * 8 + local_2f0._M_allocated_capacity) +
                      -(long)iVar7),1);
    RVar18 = local_320;
    iVar21 = (int)&header;
    iVar7 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar21);
    iVar8 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar21);
    Imf_3_2::TiledRgbaInputFile::readTiles(iVar21,0,iVar7 + -1,0,iVar8 + -1);
    cVar5 = Imf_3_2::isLossyCompression(RVar18._0_4_);
    if (cVar5 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar23 = &(p1._data)->a;
      phVar16 = (half *)(local_2f0._M_allocated_capacity + 6);
      for (lVar28 = 0; lVar28 <= (int)lVar25; lVar28 = lVar28 + 1) {
        lVar24 = 0;
        while (lVar24 <= (int)lVar27) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x29f,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2a0,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2a1,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4]._h * 4);
          lVar19 = lVar24 * 4;
          lVar24 = lVar24 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2a2,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar23 = phVar23 + p1._sizeY * 4;
        phVar16 = phVar16 + local_2f8 * 4;
      }
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&out);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
    anon_unknown.dwarf_12400a::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)uVar3);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar7)
    ;
    piVar10 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar7 = *piVar10;
    lVar27 = (long)piVar10[2] - (long)iVar7;
    iVar8 = piVar10[1];
    lVar25 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
              ((Array2D<Imf_3_2::Rgba> *)&header,lVar25 + 1,lVar27 + 1);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(ulong)(local_348 + (-(long)iVar8 * local_350 - (long)iVar7)),1);
    RVar18 = local_320;
    iVar7 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&ofs);
    iVar8 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&ofs);
    Imf_3_2::TiledRgbaInputFile::readTiles((int)&ofs,0,iVar7 + -1,0,iVar8 + -1);
    cVar5 = Imf_3_2::isLossyCompression(RVar18._0_4_);
    if (cVar5 == '\0') {
      std::operator<<((ostream *)&std::cout,", comparing");
      phVar23 = &(p1._data)->a;
      phVar16 = &local_348->a;
      for (lVar28 = 0; lVar28 <= (int)lVar25; lVar28 = lVar28 + 1) {
        lVar24 = 0;
        while (lVar24 <= (int)lVar27) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2be,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2bf,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2c0,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4]._h * 4);
          lVar19 = lVar24 * 4;
          lVar24 = lVar24 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x2c1,
                          "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar23 = phVar23 + p1._sizeY * 4;
        phVar16 = phVar16 + local_350 * 4;
      }
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&header);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    anon_unknown.dwarf_12400a::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    remove((char *)uVar3);
    std::__cxx11::string::~string((string *)&f);
    poVar9 = std::operator<<((ostream *)&std::cout,"tiled stringstream:");
    std::endl<char,std::char_traits<char>>(poVar9);
    _header = (Rgba)&local_348;
    local_350 = 0;
    local_348 = (Rgba *)((ulong)local_348 & 0xffffffffffffff00);
    std::operator<<((ostream *)&std::cout,"writing");
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    f._map._M_t._M_impl._0_8_ = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&f,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,0x14,0x14,
               ONE_LEVEL,ROUND_DOWN,iVar7);
    Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar22 = (int)(Rgba *)&out;
    iVar7 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar22);
    iVar8 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar22);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar22,0,iVar7 + -1,0,iVar8 + -1);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_2::Header::~Header((Header *)&ofs);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading");
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar7)
    ;
    piVar10 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar7 = *piVar10;
    lVar28 = (long)piVar10[2] - (long)iVar7;
    iVar8 = piVar10[1];
    lVar27 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&f,lVar27 + 1,lVar28 + 1);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,
               (long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
               (long)iVar7 * -8 +
               -(long)iVar8 * f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8,1);
    iVar22 = (int)(Rgba *)&ofs;
    iVar7 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar22);
    iVar8 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar22);
    Imf_3_2::TiledRgbaInputFile::readTiles(iVar22,0,iVar7 + -1,0,iVar8 + -1);
    std::operator<<((ostream *)&std::cout,", comparing");
    RVar18 = local_320;
    phVar16 = &(p1._data)->a;
    iVar7 = (int)p1._sizeY * 8;
    puVar14 = &(f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x6;
    for (lVar25 = 0; lVar25 <= (int)lVar27; lVar25 = lVar25 + 1) {
      lVar24 = 0;
      while (lVar24 <= (int)lVar28) {
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar14 + lVar24 * 8 + -6) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].r == p1[y][x].r",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3d0,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar14 + lVar24 * 8 + -4) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].g == p1[y][x].g",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3d1,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(puVar14 + lVar24 * 8 + -2) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].b == p1[y][x].b",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3d2,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
        fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(puVar14 + lVar24 * 8) * 4
                          );
        lVar19 = lVar24 * 4;
        lVar24 = lVar24 + 1;
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar19]._h * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("p2[y][x].a == p1[y][x].a",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                        ,0x3d3,
                        "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                       );
        }
      }
      phVar16 = phVar16 + p1._sizeY * 4;
      puVar14 = puVar14 + f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8;
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&f);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&header);
    anon_unknown.dwarf_12400a::fillPixels1(&p1,iVar7,h_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,tempDir
                   ,"imf_test_streams3.exr");
    __filename = _out;
    poVar9 = std::operator<<((ostream *)&std::cout,"scan-line based multipart file:");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"writing");
    remove((char *)__filename);
    std::ofstream::ofstream(&os);
    std::filebuf::open(local_230,__filename._0_4_);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)__filename);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              (&headers,2,(allocator_type *)&header);
    f._map._M_t._M_impl._0_8_ = 0;
    CVar17 = RVar18._0_4_;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&f,1.0,INCREASING_Y,CVar17);
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start,&header);
    Imf_3_2::Header::~Header(&header);
    pHVar15 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&header,"part1",(allocator<char> *)&f);
    Imf_3_2::Header::setName((string *)pHVar15);
    std::__cxx11::string::~string((string *)&header);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8c3);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8d6);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8e9);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x1a9352);
    Imf_3_2::Header::setType
              ((string *)
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + 0x38,
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    pHVar15 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&header,"part2",(allocator<char> *)&f);
    Imf_3_2::Header::setName((string *)(pHVar15 + 0x38));
    std::__cxx11::string::~string((string *)&header);
    pHVar15 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile(&out_4,(OStream *)&ofs,pHVar15,2,false,iVar7);
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &f._map._M_t._M_impl.super__Rb_tree_header._M_header;
    f._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x19f8c3);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)&(p1._data)->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x19f8d6);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)&(p1._data)->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x19f8e9);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)&(p1._data)->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x1a9352);
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&header,&out_4,iVar7);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_2::OutputPart::writePixels(iVar21);
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&f);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&out_4);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    std::ofstream::~ofstream(&os);
    std::operator<<((ostream *)&std::cout,", reading");
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,__filename._0_4_);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)__filename);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out_4,(IStream *)&ofs,iVar7,true);
    iVar7 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar7 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1d5,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out_4);
    pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&out_4);
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar6 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar12,pBVar13);
    if (!bVar6) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1d7,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    local_320 = __filename;
    Imf_3_2::MultiPartInputFile::header((int)&out_4);
    piVar10 = (int *)Imf_3_2::Header::dataWindow();
    iVar7 = piVar10[2];
    lVar24 = (long)*piVar10;
    lVar25 = (iVar7 - lVar24) + 1;
    iVar8 = piVar10[1];
    lVar27 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&headers,lVar27 + 1,lVar25);
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &f._map._M_t._M_impl.super__Rb_tree_header._M_header;
    f._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar28 = -(long)iVar8;
    uVar26 = lVar25 * 8;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,
               (char *)(headers.
                        super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage +
                       lVar24 * -8 +
                       (long)headers.
                             super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                             _M_impl.super__Vector_impl_data._M_finish * lVar28 * 8),8,uVar26,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x19f8c3);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,
               (char *)(headers.
                        super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage +
                       lVar24 * -8 +
                       (long)headers.
                             super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                             _M_impl.super__Vector_impl_data._M_finish * lVar28 * 8 + 2),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x19f8d6);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,
               (char *)(headers.
                        super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage +
                       lVar24 * -8 +
                       (long)headers.
                             super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                             _M_impl.super__Vector_impl_data._M_finish * lVar28 * 8 + 4),8,uVar26,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x19f8e9);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,
               (char *)(headers.
                        super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage +
                       lVar24 * -8 +
                       lVar28 * (long)headers.
                                      super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                      ._M_impl.super__Vector_impl_data._M_finish * 8 + 6),8,uVar26,1
               ,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&f,(Slice *)0x1a9352);
    RVar18 = local_320;
    local_298 = (int)(iVar7 - lVar24);
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      Imf_3_2::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&out_4,iVar7);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_2::InputPart::readPixels(iVar21,piVar10[1]);
      cVar5 = Imf_3_2::isLossyCompression(CVar17);
      if (cVar5 == '\0') {
        poVar9 = std::operator<<((ostream *)&std::cout,", comparing pt ");
        std::ostream::operator<<(poVar9,iVar7);
        phVar16 = &(p1._data)->a;
        pHVar15 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 6;
        for (lVar25 = 0; lVar25 <= (int)lVar27; lVar25 = lVar25 + 1) {
          lVar28 = 0;
          while (lVar28 <= local_298) {
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pHVar15 + lVar28 * 8 + -6) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar28 * 4 + -3]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x20b,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pHVar15 + lVar28 * 8 + -4) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar28 * 4 + -2]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x20c,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pHVar15 + lVar28 * 8 + -2) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar28 * 4 + -1]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x20d,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pHVar15 + lVar28 * 8) * 4);
            lVar24 = lVar28 * 4;
            lVar28 = lVar28 + 1;
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x20e,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
          }
          phVar16 = phVar16 + p1._sizeY * 4;
          pHVar15 = pHVar15 + (long)headers.
                                    super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_finish * 8;
        }
      }
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&f);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&headers);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&out_4);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
    anon_unknown.dwarf_12400a::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)RVar18);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&headers,(IStream *)&os,iVar7,true);
    iVar7 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar7 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x21a,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar6 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar12,pBVar13);
    if (!bVar6) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x21c,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    piVar10 = (int *)Imf_3_2::Header::dataWindow();
    iVar7 = piVar10[2];
    lVar24 = (long)*piVar10;
    lVar25 = (iVar7 - lVar24) + 1;
    iVar8 = piVar10[1];
    lVar27 = (long)piVar10[3] - (long)iVar8;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&f,lVar27 + 1,lVar25);
    local_350 = local_350 & 0xffffffff00000000;
    local_348 = (Rgba *)0x0;
    local_340 = &local_350;
    local_330 = 0;
    lVar28 = -(long)iVar8;
    uVar26 = lVar25 * 8;
    local_338 = local_340;
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)((long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                       lVar24 * -8 +
                       f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * lVar28 * 8),8,
               uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8c3);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)((long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                       lVar24 * -8 +
                       f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * lVar28 * 8 + 2),8
               ,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8d6);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)((long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                       lVar24 * -8 +
                       f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * lVar28 * 8 + 4),8
               ,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8e9);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)((long)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                       lVar24 * -8 +
                       lVar28 * f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8 + 6),8
               ,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1a9352);
    RVar18 = local_320;
    local_298 = (int)(iVar7 - lVar24);
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      Imf_3_2::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&headers,iVar7);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::InputPart::readPixels((int)&ofs,piVar10[1]);
      cVar5 = Imf_3_2::isLossyCompression(CVar17);
      if (cVar5 == '\0') {
        poVar9 = std::operator<<((ostream *)&std::cout,", comparing pt ");
        std::ostream::operator<<(poVar9,iVar7);
        phVar16 = &(p1._data)->a;
        puVar14 = &(f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x6;
        for (lVar25 = 0; lVar25 <= (int)lVar27; lVar25 = lVar25 + 1) {
          lVar28 = 0;
          while (lVar28 <= local_298) {
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(puVar14 + lVar28 * 8 + -6) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar28 * 4 + -3]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x250,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(puVar14 + lVar28 * 8 + -4) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar28 * 4 + -2]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x251,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(puVar14 + lVar28 * 8 + -2) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar28 * 4 + -1]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x252,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(puVar14 + lVar28 * 8) * 4);
            lVar24 = lVar28 * 4;
            lVar28 = lVar28 + 1;
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24]._h * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x253,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
          }
          phVar16 = phVar16 + p1._sizeY * 4;
          puVar14 = puVar14 + f._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ * 8;
        }
      }
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&f);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&headers);
    anon_unknown.dwarf_12400a::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    remove((char *)RVar18);
    std::__cxx11::string::~string((string *)&out);
    poVar9 = std::operator<<((ostream *)&std::cout,"scan-line based multipart stringstream:");
    std::endl<char,std::char_traits<char>>(poVar9);
    f._map._M_t._M_impl._0_8_ = &f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)f._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00)
    ;
    std::operator<<((ostream *)&std::cout,"writing");
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)&out,2,
               (allocator_type *)&ofs);
    _header = 0;
    hStack_356._h = 0;
    hStack_354._h = 0;
    hStack_352._h = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    Imf_3_2::Header::operator=((Header *)_out,(Header *)&ofs);
    Imf_3_2::Header::~Header((Header *)&ofs);
    RVar18 = _out;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"part1",(allocator<char> *)&header);
    Imf_3_2::Header::setName((string *)RVar18);
    std::__cxx11::string::~string((string *)&ofs);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8c3);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8d6);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8e9);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x1a9352);
    Imf_3_2::Header::setType((string *)_out);
    Imf_3_2::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    RVar18 = _out;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofs,"part2",(allocator<char> *)&header);
    Imf_3_2::Header::setName((string *)((long)RVar18 + 0x38));
    std::__cxx11::string::~string((string *)&ofs);
    RVar18 = _out;
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              ((MultiPartOutputFile *)&headers,(OStream *)&os,(Header *)RVar18,2,false,iVar7);
    local_350 = local_350 & 0xffffffff00000000;
    local_348 = (Rgba *)0x0;
    local_340 = &local_350;
    local_330 = 0;
    local_338 = local_340;
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8c3);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)&(p1._data)->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8d6);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)&(p1._data)->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8e9);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)&(p1._data)->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1a9352);
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&ofs,(MultiPartOutputFile *)&headers,iVar7);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::OutputPart::writePixels((int)(OutputPart *)&ofs);
    }
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&f,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&headers);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)&out);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::operator<<((ostream *)&std::cout,", reading");
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&headers,(IStream *)&os,iVar7,true);
    iVar7 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar7 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x35d,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    pBVar12 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar6 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar12,pBVar13);
    if (!bVar6) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x35f,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    piVar10 = (int *)Imf_3_2::Header::dataWindow();
    lVar24 = (long)*piVar10;
    local_320 = (Rgba)(piVar10[2] - lVar24);
    lVar25 = (long)local_320 + 1;
    iVar7 = piVar10[1];
    lVar27 = (long)piVar10[3] - (long)iVar7;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D((Array2D<Imf_3_2::Rgba> *)&out,lVar27 + 1,lVar25);
    local_350 = local_350 & 0xffffffff00000000;
    local_348 = (Rgba *)0x0;
    local_340 = &local_350;
    local_330 = 0;
    lVar28 = -(long)iVar7;
    uVar26 = lVar25 * 8;
    local_338 = local_340;
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)((Rgba *)(local_2f8 * lVar28 * 8 + local_2f0._M_allocated_capacity) + -lVar24
                       ),8,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8c3);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)&((Rgba *)(local_2f8 * lVar28 * 8 + local_2f0._M_allocated_capacity))
                        [-lVar24].g,8,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8d6);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)&((Rgba *)(local_2f8 * lVar28 * 8 + local_2f0._M_allocated_capacity))
                        [-lVar24].b,8,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x19f8e9);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,
               (char *)&((Rgba *)(lVar28 * local_2f8 * 8 + local_2f0._M_allocated_capacity))
                        [-lVar24].a,8,uVar26,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1a9352);
    lVar25 = (long)(int)local_320._0_4_;
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      Imf_3_2::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&headers,iVar7);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::InputPart::readPixels((int)&ofs,piVar10[1]);
      poVar9 = std::operator<<((ostream *)&std::cout,", comparing pt ");
      std::ostream::operator<<(poVar9,iVar7);
      phVar23 = &(p1._data)->a;
      phVar16 = (half *)(local_2f0._M_allocated_capacity + 6);
      for (lVar28 = 0; lVar28 <= (int)lVar27; lVar28 = lVar28 + 1) {
        lVar24 = 0;
        while (lVar24 <= lVar25) {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -3]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -3]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x391,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -2]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -2]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x392,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4 + -1]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar24 * 4 + -1]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x393,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar24 * 4]._h * 4);
          lVar19 = lVar24 * 4;
          lVar24 = lVar24 + 1;
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar19]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x394,
                          "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                         );
          }
        }
        phVar23 = phVar23 + p1._sizeY * 4;
        phVar16 = phVar16 + local_2f8 * 4;
      }
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&out);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&headers);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&f);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p1);
    uVar26 = (ulong)(CVar17 + RLE_COMPRESSION);
  } while( true );
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
               (tempDir + "imf_test_streams.exr").c_str (),
               W,
               H,
               static_cast<Compression>(compression),
               p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
               (tempDir + "imf_test_streams2.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
               (tempDir + "imf_test_streams3.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}